

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTune.c
# Opt level: O0

int Ifn_ManStrCheck(char *pStr,int *pnInps,int *pnObjs)

{
  int iVar1;
  int local_bc;
  int local_b8;
  int MaxVar;
  int Marks [32];
  int local_30;
  int local_2c;
  int nNodes;
  int i;
  int *pnObjs_local;
  int *pnInps_local;
  char *pStr_local;
  
  local_30 = 0;
  memset(&local_b8,0,0x80);
  local_bc = -1;
  local_2c = 0;
  do {
    if (pStr[local_2c] == '\0') {
      local_2c = 0;
      while( true ) {
        if (local_bc < local_2c) {
          *pnInps = local_bc + 1;
          *pnObjs = local_bc + 1 + local_30;
          return 1;
        }
        if ((&local_b8)[local_2c] == 0) break;
        local_2c = local_2c + 1;
      }
      iVar1 = Ifn_ErrorMessage("String \"%s\" has no symbol \'%c\'.\n",pStr,(ulong)(local_2c + 0x61)
                              );
      return iVar1;
    }
    iVar1 = Inf_ManOpenSymb(pStr + local_2c);
    if (iVar1 != 0) {
      local_30 = local_30 + 1;
    }
    if (((((((pStr[local_2c] != ';') && (pStr[local_2c] != '(')) && (pStr[local_2c] != ')')) &&
          ((pStr[local_2c] != '[' && (pStr[local_2c] != ']')))) &&
         ((pStr[local_2c] != '<' && ((pStr[local_2c] != '>' && (pStr[local_2c] != '{')))))) &&
        (pStr[local_2c] != '}')) && ((pStr[local_2c] < 'A' || ('Z' < pStr[local_2c])))) {
      if ((pStr[local_2c] < 'a') || ('z' < pStr[local_2c])) {
        iVar1 = Ifn_ErrorMessage("String \"%s\" contains unrecognized symbol \'%c\'.\n",pStr,
                                 (ulong)(uint)(int)pStr[local_2c]);
        return iVar1;
      }
      local_bc = Abc_MaxInt(local_bc,pStr[local_2c] + -0x61);
      (&local_b8)[pStr[local_2c] + -0x61] = 1;
    }
    local_2c = local_2c + 1;
  } while( true );
}

Assistant:

int Ifn_ManStrCheck( char * pStr, int * pnInps, int * pnObjs )
{
    int i, nNodes = 0, Marks[32] = {0}, MaxVar = -1;
    for ( i = 0; pStr[i]; i++ )
    {
        if ( Inf_ManOpenSymb(pStr+i) )
            nNodes++;
        if ( pStr[i] == ';' || 
             pStr[i] == '(' || pStr[i] == ')' || 
             pStr[i] == '[' || pStr[i] == ']' || 
             pStr[i] == '<' || pStr[i] == '>' || 
             pStr[i] == '{' || pStr[i] == '}' )
            continue;
        if ( pStr[i] >= 'A' && pStr[i] <= 'Z' )
            continue;
        if ( pStr[i] >= 'a' && pStr[i] <= 'z' )
        {
            MaxVar = Abc_MaxInt( MaxVar, (int)(pStr[i] - 'a') );
            Marks[pStr[i] - 'a'] = 1;
            continue;
        }
        return Ifn_ErrorMessage( "String \"%s\" contains unrecognized symbol \'%c\'.\n", pStr, pStr[i] );
    }
    for ( i = 0; i <= MaxVar; i++ )
        if ( Marks[i] == 0 )
            return Ifn_ErrorMessage( "String \"%s\" has no symbol \'%c\'.\n", pStr, 'a' + i );
    *pnInps = MaxVar + 1;
    *pnObjs = MaxVar + 1 + nNodes;
    return 1;
}